

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_lexer.c
# Opt level: O0

_Bool is_builtin_operator(int c)

{
  undefined1 local_d;
  int c_local;
  
  local_d = true;
  if ((((((c != 0x2b) && (local_d = true, c != 0x2d)) && (local_d = true, c != 0x2a)) &&
       (((local_d = true, c != 0x2f && (local_d = true, c != 0x3c)) &&
        ((local_d = true, c != 0x3e && ((local_d = true, c != 0x21 && (local_d = true, c != 0x3d))))
        )))) && ((local_d = true, c != 0x7c &&
                 ((((((local_d = true, c != 0x26 && (local_d = true, c != 0x5e)) &&
                     (local_d = true, c != 0x25)) &&
                    ((local_d = true, c != 0x7e && (local_d = true, c != 0x2e)))) &&
                   ((local_d = true, c != 0x3b &&
                    ((local_d = true, c != 0x3a && (local_d = true, c != 0x3f)))))) &&
                  (local_d = true, c != 0x2c)))))) &&
     ((((local_d = true, c != 0x7b && (local_d = true, c != 0x7d)) && (local_d = true, c != 0x5b))
      && ((local_d = true, c != 0x5d && (local_d = true, c != 0x28)))))) {
    local_d = c == 0x29;
  }
  return local_d;
}

Assistant:

static inline bool is_builtin_operator (int c) {
    // PARENTHESIS
    // { } [ ] ( )
    // PUNCTUATION
    // . ; : ? ,
    // OPERATORS
    // + - * / < > ! = | & ^ % ~

    return ((c == '+') || (c == '-') || (c == '*') || (c == '/') ||
            (c == '<') || (c == '>') || (c == '!') || (c == '=') ||
            (c == '|') || (c == '&') || (c == '^') || (c == '%') ||
            (c == '~') || (c == '.') || (c == ';') || (c == ':') ||
            (c == '?') || (c == ',') || (c == '{') || (c == '}') ||
            (c == '[') || (c == ']') || (c == '(') || (c == ')') );
}